

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDress2.c
# Opt level: O1

Vec_Ptr_t *
Abc_NtkDressComputeEquivs(Abc_Ntk_t *pNtk1,Abc_Ntk_t *pNtk2,int nConflictLimit,int fVerbose)

{
  Abc_Ntk_t *pNtk;
  Abc_Ntk_t *pNtk_00;
  Aig_Man_t *p1;
  Aig_Man_t *p2;
  Aig_Man_t *pAig;
  Vec_Ptr_t *pVVar1;
  Dch_Pars_t Pars;
  Dch_Pars_t local_70;
  
  if (pNtk1->ntkType == ABC_NTK_STRASH) {
    __assert_fail("!Abc_NtkIsStrash(pNtk1)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcDress2.c"
                  ,0x128,"Vec_Ptr_t *Abc_NtkDressComputeEquivs(Abc_Ntk_t *, Abc_Ntk_t *, int, int)")
    ;
  }
  if (pNtk2->ntkType != ABC_NTK_STRASH) {
    pNtk = Abc_NtkStrash(pNtk1,1,1,0);
    pNtk_00 = Abc_NtkStrash(pNtk2,1,1,0);
    p1 = Abc_NtkToDar(pNtk,0,0);
    p2 = Abc_NtkToDar(pNtk_00,0,0);
    pAig = Aig_ManCreateDualOutputMiter(p1,p2);
    Dch_ManSetDefaultParams(&local_70);
    local_70.nBTLimit = nConflictLimit;
    local_70.fVerbose = fVerbose;
    Dch_ComputeEquivalences(pAig,&local_70);
    pVVar1 = Abc_NtkDressMapIds(pAig,pNtk1,pNtk2);
    Aig_ManStop(pAig);
    Aig_ManStop(p1);
    Aig_ManStop(p2);
    Abc_NtkDelete(pNtk);
    Abc_NtkDelete(pNtk_00);
    return pVVar1;
  }
  __assert_fail("!Abc_NtkIsStrash(pNtk2)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcDress2.c"
                ,0x129,"Vec_Ptr_t *Abc_NtkDressComputeEquivs(Abc_Ntk_t *, Abc_Ntk_t *, int, int)");
}

Assistant:

Vec_Ptr_t * Abc_NtkDressComputeEquivs( Abc_Ntk_t * pNtk1, Abc_Ntk_t * pNtk2, int nConflictLimit, int fVerbose )
{
    Dch_Pars_t Pars, * pPars = &Pars;
    Abc_Ntk_t * pAig1, * pAig2;
    Aig_Man_t * pMan1, * pMan2, * pMiter;
    Vec_Ptr_t * vRes;
    assert( !Abc_NtkIsStrash(pNtk1) );
    assert( !Abc_NtkIsStrash(pNtk2) );
    // convert network into AIG
    pAig1 = Abc_NtkStrash( pNtk1, 1, 1, 0 );
    pAig2 = Abc_NtkStrash( pNtk2, 1, 1, 0 );
    pMan1 = Abc_NtkToDar( pAig1, 0, 0 );
    pMan2 = Abc_NtkToDar( pAig2, 0, 0 );
    // derive the miter
    pMiter = Aig_ManCreateDualOutputMiter( pMan1, pMan2 );
    // set up parameters for SAT sweeping
    Dch_ManSetDefaultParams( pPars );
    pPars->nBTLimit = nConflictLimit;
    pPars->fVerbose = fVerbose;
    // perform SAT sweeping
    Dch_ComputeEquivalences( pMiter, pPars );
    // now, pMiter is annotated with the equivl class info
    // convert this info into the resulting array
    vRes = Abc_NtkDressMapIds( pMiter, pNtk1, pNtk2 );
    Aig_ManStop( pMiter );
    Aig_ManStop( pMan1 );
    Aig_ManStop( pMan2 );
    Abc_NtkDelete( pAig1 );
    Abc_NtkDelete( pAig2 );
    return vRes;
}